

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

string * __thiscall
deqp::gls::Array::outputTypeToString_abi_cxx11_
          (string *__return_storage_ptr__,Array *this,OutputType type)

{
  char *__s;
  char **ppcVar1;
  allocator<char> local_15;
  Type_conflict1 local_14;
  string *psStack_10;
  OutputType type_local;
  
  local_14 = (Type_conflict1)this;
  psStack_10 = __return_storage_ptr__;
  ppcVar1 = de::getSizedArrayElement<12,12,char_const*>(&outputTypeToString::types,local_14);
  __s = *ppcVar1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_15)
  ;
  std::allocator<char>::~allocator(&local_15);
  return __return_storage_ptr__;
}

Assistant:

std::string Array::outputTypeToString(OutputType type)
{
	static const char* types[] =
	{
		"float",		// OUTPUTTYPE_FLOAT = 0,
		"vec2",			// OUTPUTTYPE_VEC2,
		"vec3",			// OUTPUTTYPE_VEC3,
		"vec4",			// OUTPUTTYPE_VEC4,

		"int",			// OUTPUTTYPE_INT,
		"uint",			// OUTPUTTYPE_UINT,

		"ivec2",		// OUTPUTTYPE_IVEC2,
		"ivec3",		// OUTPUTTYPE_IVEC3,
		"ivec4",		// OUTPUTTYPE_IVEC4,

		"uvec2",		// OUTPUTTYPE_UVEC2,
		"uvec3",		// OUTPUTTYPE_UVEC3,
		"uvec4",		// OUTPUTTYPE_UVEC4,
	};

	return de::getSizedArrayElement<Array::OUTPUTTYPE_LAST>(types, (int)type);
}